

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Vdbe * sqlite3GetVdbe(Parse *pParse)

{
  Parse *pParse_local;
  
  if (pParse->pVdbe == (Vdbe *)0x0) {
    if ((pParse->pToplevel == (Parse *)0x0) && ((pParse->db->dbOptFlags & 8) == 0)) {
      pParse->okConstFactor = '\x01';
    }
    pParse_local = (Parse *)sqlite3VdbeCreate(pParse);
  }
  else {
    pParse_local = (Parse *)pParse->pVdbe;
  }
  return (Vdbe *)pParse_local;
}

Assistant:

SQLITE_PRIVATE Vdbe *sqlite3GetVdbe(Parse *pParse){
  if( pParse->pVdbe ){
    return pParse->pVdbe;
  }
  if( pParse->pToplevel==0
   && OptimizationEnabled(pParse->db,SQLITE_FactorOutConst)
  ){
    pParse->okConstFactor = 1;
  }
  return sqlite3VdbeCreate(pParse);
}